

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void heap_sort(u32 *A,uint length)

{
  u32 uVar1;
  u32 *A_00;
  uint in_ESI;
  u32 *in_RDI;
  u32 tmp;
  uint in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  A_00 = in_RDI + -1;
  heapify_array((u32 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  while (1 < in_ESI) {
    uVar1 = A_00[in_ESI];
    A_00[in_ESI] = *in_RDI;
    *in_RDI = uVar1;
    in_ESI = in_ESI - 1;
    heapify_subtree(A_00,in_ESI,1);
  }
  return;
}

Assistant:

static void
heap_sort(u32 A[], unsigned length)
{
	A--; /* Use 1-based indices  */

	heapify_array(A, length);

	while (length >= 2) {
		u32 tmp = A[length];

		A[length] = A[1];
		A[1] = tmp;
		length--;
		heapify_subtree(A, length, 1);
	}
}